

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

void Fra_ClassesPrint(Fra_Cla_t *p,int fVeryVerbose)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t **pClass_00;
  uint local_2c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t **pClass;
  int fVeryVerbose_local;
  Fra_Cla_t *p_local;
  
  uVar2 = Vec_PtrSize(p->vClasses1);
  uVar3 = Vec_PtrSize(p->vClasses);
  uVar4 = Fra_ClassesCountLits(p);
  printf("Const = %5d. Class = %5d. Lit = %5d. ",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  if ((p->vImps != (Vec_Int_t *)0x0) && (iVar5 = Vec_IntSize(p->vImps), 0 < iVar5)) {
    uVar2 = Vec_IntSize(p->vImps);
    printf("Imp = %5d. ",(ulong)uVar2);
  }
  printf("\n");
  if (fVeryVerbose != 0) {
    for (local_2c = 0; iVar5 = Vec_PtrSize(p->vClasses1), (int)local_2c < iVar5;
        local_2c = local_2c + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vClasses1,local_2c);
      pAVar6 = Fra_ClassObjRepr(pAVar6);
      pAVar7 = Aig_ManConst1(p->pAig);
      if (pAVar6 != pAVar7) {
        __assert_fail("Fra_ClassObjRepr(pObj) == Aig_ManConst1(p->pAig)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                      ,0xfb,"void Fra_ClassesPrint(Fra_Cla_t *, int)");
      }
    }
    printf("Constants { ");
    for (local_2c = 0; iVar5 = Vec_PtrSize(p->vClasses1), (int)local_2c < iVar5;
        local_2c = local_2c + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vClasses1,local_2c);
      uVar2 = pAVar6->Id;
      uVar1 = *(undefined8 *)&pAVar6->field_0x18;
      uVar3 = Aig_SupportSize(p->pAig,pAVar6);
      printf("%d(%d,%d) ",(ulong)uVar2,(ulong)((uint)((ulong)uVar1 >> 0x20) & 0xffffff),(ulong)uVar3
            );
    }
    printf("}\n");
    for (local_2c = 0; iVar5 = Vec_PtrSize(p->vClasses), (int)local_2c < iVar5;
        local_2c = local_2c + 1) {
      pClass_00 = (Aig_Obj_t **)Vec_PtrEntry(p->vClasses,local_2c);
      uVar2 = Fra_ClassCount(pClass_00);
      printf("%3d (%3d) : ",(ulong)local_2c,(ulong)uVar2);
      Fra_PrintClass(p,pClass_00);
    }
    printf("\n");
  }
  return;
}

Assistant:

void Fra_ClassesPrint( Fra_Cla_t * p, int fVeryVerbose )
{
    Aig_Obj_t ** pClass;
    Aig_Obj_t * pObj;
    int i;

    printf( "Const = %5d. Class = %5d. Lit = %5d. ", 
        Vec_PtrSize(p->vClasses1), Vec_PtrSize(p->vClasses), Fra_ClassesCountLits(p) );
    if ( p->vImps && Vec_IntSize(p->vImps) > 0 )
        printf( "Imp = %5d. ", Vec_IntSize(p->vImps) );
    printf( "\n" );

    if ( fVeryVerbose )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vClasses1, pObj, i )
            assert( Fra_ClassObjRepr(pObj) == Aig_ManConst1(p->pAig) );
        printf( "Constants { " );
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vClasses1, pObj, i )
            printf( "%d(%d,%d) ", pObj->Id, pObj->Level, Aig_SupportSize(p->pAig,pObj) );
        printf( "}\n" );
        Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
        {
            printf( "%3d (%3d) : ", i, Fra_ClassCount(pClass) );
            Fra_PrintClass( p, pClass );
        }
        printf( "\n" );
    }
}